

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_fragment_uri.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1109b::FragmentURITest_SelectorRangeToString_Test::TestBody
          (FragmentURITest_SelectorRangeToString_Test *this)

{
  bool bVar1;
  AssertHelperData *pAVar2;
  char *pcVar3;
  size_t sVar4;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_ktx::SelectorRange>
  *file;
  AssertHelper *this_00;
  char *extraout_RDX;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  AssertHelper *in_stack_fffffffffffff7d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff7d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *lhs;
  char *in_stack_fffffffffffff7e0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_ktx::SelectorRange>
  *__return_storage_ptr__;
  char *in_stack_fffffffffffff7e8;
  int line;
  SelectorRange *in_stack_fffffffffffff7f0;
  undefined8 in_stack_fffffffffffff7f8;
  Type type;
  AssertHelper *in_stack_fffffffffffff800;
  AssertHelper *this_01;
  Message *in_stack_fffffffffffff848;
  AssertHelper *in_stack_fffffffffffff850;
  AssertHelper *this_02;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_ktx::SelectorRange>
  local_730;
  SelectorRange *local_718;
  size_type local_710;
  v10 local_708 [32];
  AssertionResult local_6e8 [2];
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_ktx::SelectorRange>
  local_6c8;
  AssertHelper local_6b0;
  undefined8 local_6a8;
  v10 local_6a0 [32];
  AssertionResult local_680 [2];
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_ktx::SelectorRange>
  local_660;
  SelectorRange *local_648;
  size_t local_640;
  v10 local_638 [32];
  AssertionResult local_618 [2];
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_ktx::SelectorRange>
  local_5f8;
  AssertHelper local_5e0;
  undefined8 local_5d8;
  v10 local_5d0 [8];
  format_args in_stack_fffffffffffffa38;
  string_view in_stack_fffffffffffffa48;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_ktx::SelectorRange>
  local_590;
  SelectorRange *local_578;
  size_t local_570;
  v10 local_568 [32];
  AssertionResult local_548 [3];
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_ktx::SelectorRange>
  local_518;
  SelectorRange *local_500;
  size_t local_4f8;
  v10 local_4f0 [32];
  AssertionResult local_4d0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_ktx::SelectorRange>
  *local_4b8 [2];
  undefined8 local_4a8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_ktx::SelectorRange>
  **local_4a0;
  SelectorRange *local_498;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_ktx::SelectorRange>
  *local_488;
  SelectorRange *local_480;
  size_type sStack_478;
  v10 *local_470;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_ktx::SelectorRange>
  *local_468 [2];
  undefined8 local_458;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_ktx::SelectorRange>
  **local_450;
  AssertHelperData *local_448;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_ktx::SelectorRange>
  *local_438;
  AssertHelperData *local_430;
  undefined8 uStack_428;
  v10 *local_420;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_ktx::SelectorRange>
  *local_418 [2];
  undefined8 local_408;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_ktx::SelectorRange>
  **local_400;
  SelectorRange *local_3f8;
  size_t local_3f0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_ktx::SelectorRange>
  *local_3e8;
  SelectorRange *local_3e0;
  size_t sStack_3d8;
  v10 *local_3d0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_ktx::SelectorRange>
  *local_3c8 [2];
  undefined8 local_3b8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_ktx::SelectorRange>
  **local_3b0;
  AssertHelperData *local_3a8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_ktx::SelectorRange>
  *local_398;
  AssertHelperData *local_390;
  undefined8 uStack_388;
  v10 *local_380;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_ktx::SelectorRange>
  *local_378 [2];
  undefined8 local_368;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_ktx::SelectorRange>
  **local_360;
  SelectorRange *local_358;
  size_t local_350;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_ktx::SelectorRange>
  *local_348;
  SelectorRange *local_340;
  size_t sStack_338;
  v10 *local_330;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_ktx::SelectorRange>
  *local_328 [3];
  undefined8 local_310;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_ktx::SelectorRange>
  **local_308;
  SelectorRange *local_300;
  size_t local_2f8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_ktx::SelectorRange>
  *local_2f0;
  SelectorRange *local_2e8;
  size_t sStack_2e0;
  v10 *local_2d8;
  char *local_2d0;
  SelectorRange **local_2c8;
  char *local_2c0;
  SelectorRange **local_2b8;
  char *local_2b0;
  SelectorRange **local_2a8;
  char *local_2a0;
  SelectorRange **local_298;
  char *local_290;
  AssertHelper *local_288;
  char *local_280;
  AssertHelper *local_278;
  char *local_270;
  SelectorRange **local_268;
  char *local_260;
  SelectorRange **local_258;
  char *local_250;
  AssertHelper *local_248;
  char *local_240;
  AssertHelper *local_238;
  char *local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_228;
  char *local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_218;
  SelectorRange **local_210;
  SelectorRange *local_208;
  size_t sStack_200;
  SelectorRange **local_1f0;
  SelectorRange *local_1e8;
  size_t sStack_1e0;
  AssertHelperData **local_1d0;
  AssertHelperData *local_1c8;
  SelectorRange **local_1b0;
  SelectorRange *local_1a8;
  size_t sStack_1a0;
  AssertHelperData **local_190;
  AssertHelperData *local_188;
  SelectorRange **local_170;
  SelectorRange *local_168;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_ktx::SelectorRange>
  **local_150;
  undefined8 *local_148;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_ktx::SelectorRange>
  **local_140;
  undefined8 local_138;
  undefined8 *local_130;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_ktx::SelectorRange>
  **local_128;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_ktx::SelectorRange>
  **local_120;
  undefined8 *local_118;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_ktx::SelectorRange>
  **local_110;
  undefined8 local_108;
  undefined8 *local_100;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_ktx::SelectorRange>
  **local_f8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_ktx::SelectorRange>
  **local_f0;
  undefined8 *local_e8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_ktx::SelectorRange>
  **local_e0;
  undefined8 local_d8;
  undefined8 *local_d0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_ktx::SelectorRange>
  **local_c8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_ktx::SelectorRange>
  **local_c0;
  undefined8 *local_b8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_ktx::SelectorRange>
  **local_b0;
  undefined8 local_a8;
  undefined8 *local_a0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_ktx::SelectorRange>
  **local_98;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_ktx::SelectorRange>
  **local_90;
  undefined8 *local_88;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_ktx::SelectorRange>
  **local_80;
  undefined8 local_78;
  undefined8 *local_70;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_ktx::SelectorRange>
  **local_68;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_ktx::SelectorRange>
  **local_60;
  undefined8 *local_58;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_ktx::SelectorRange>
  **local_50;
  undefined8 local_48;
  undefined8 *local_40;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_ktx::SelectorRange>
  **local_38;
  char *local_30;
  char *local_28;
  char *local_20;
  char *local_18;
  char *local_10;
  char *local_8;
  
  type = (Type)((ulong)in_stack_fffffffffffff7f8 >> 0x20);
  local_2c8 = &local_500;
  local_2d0 = "{}";
  local_2c0 = "{}";
  local_500 = (SelectorRange *)0x1d8be9;
  local_2b8 = local_2c8;
  local_4f8 = std::char_traits<char>::length((char_type *)0x12bee6);
  local_8 = local_2d0;
  ktx::SelectorRange::SelectorRange
            (in_stack_fffffffffffff7f0,(RangeIndex)((ulong)in_stack_fffffffffffff7e8 >> 0x20),
             (RangeIndex)in_stack_fffffffffffff7e8);
  local_2d8 = local_4f0;
  local_2e8 = local_500;
  sStack_2e0 = local_4f8;
  local_210 = &local_2e8;
  local_300 = local_500;
  local_2f8 = local_4f8;
  local_2f0 = &local_518;
  local_208 = local_300;
  sStack_200 = local_2f8;
  local_328[0] = fmt::v10::
                 make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,ktx::SelectorRange>
                           (&local_518,local_2d8,local_500);
  local_148 = &local_310;
  local_150 = local_328;
  local_138 = 0xf;
  local_310 = 0xf;
  local_140 = local_150;
  local_130 = local_148;
  local_128 = local_150;
  local_308 = local_150;
  fmt::v10::vformat_abi_cxx11_(in_stack_fffffffffffffa48,in_stack_fffffffffffffa38);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[5],_nullptr>
            (in_stack_fffffffffffff7e8,in_stack_fffffffffffff7e0,in_stack_fffffffffffff7d8,
             (char (*) [5])in_stack_fffffffffffff7d0);
  std::__cxx11::string::~string((string *)local_4f0);
  ktx::SelectorRange::~SelectorRange((SelectorRange *)0x12c0d2);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_4d0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff800);
    testing::AssertionResult::failure_message((AssertionResult *)0x12c14f);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff800,type,(char *)in_stack_fffffffffffff7f0,
               (int)((ulong)in_stack_fffffffffffff7e8 >> 0x20),in_stack_fffffffffffff7e0);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff850,in_stack_fffffffffffff848);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffff7d0);
    testing::Message::~Message((Message *)0x12c1b2);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x12c223);
  local_2a8 = &local_578;
  local_2b0 = "{}";
  local_2a0 = "{}";
  local_578 = (SelectorRange *)0x1d8be9;
  local_298 = local_2a8;
  local_570 = std::char_traits<char>::length((char_type *)0x12c28a);
  local_10 = local_2b0;
  ktx::SelectorRange::SelectorRange
            (in_stack_fffffffffffff7f0,(RangeIndex)((ulong)in_stack_fffffffffffff7e8 >> 0x20),
             (RangeIndex)in_stack_fffffffffffff7e8);
  local_330 = local_568;
  local_340 = local_578;
  sStack_338 = local_570;
  local_1f0 = &local_340;
  local_358 = local_578;
  local_350 = local_570;
  local_348 = &local_590;
  local_1e8 = local_358;
  sStack_1e0 = local_350;
  local_378[0] = fmt::v10::
                 make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,ktx::SelectorRange>
                           (&local_590,local_330,local_578);
  local_118 = &local_368;
  local_120 = local_378;
  local_108 = 0xf;
  local_368 = 0xf;
  local_110 = local_120;
  local_100 = local_118;
  local_f8 = local_120;
  local_360 = local_120;
  fmt::v10::vformat_abi_cxx11_(in_stack_fffffffffffffa48,in_stack_fffffffffffffa38);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[2],_nullptr>
            (in_stack_fffffffffffff7e8,in_stack_fffffffffffff7e0,in_stack_fffffffffffff7d8,
             (char (*) [2])in_stack_fffffffffffff7d0);
  std::__cxx11::string::~string((string *)local_568);
  ktx::SelectorRange::~SelectorRange((SelectorRange *)0x12c479);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_548);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff800);
    testing::AssertionResult::failure_message((AssertionResult *)0x12c508);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff800,type,(char *)in_stack_fffffffffffff7f0,
               (int)((ulong)in_stack_fffffffffffff7e8 >> 0x20),in_stack_fffffffffffff7e0);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff850,in_stack_fffffffffffff848);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffff7d0);
    testing::Message::~Message((Message *)0x12c56b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x12c5dc);
  this_02 = &local_5e0;
  local_290 = "{}";
  local_280 = "{}";
  local_5e0.data_ = (AssertHelperData *)0x1d8be9;
  local_288 = this_02;
  local_278 = this_02;
  pAVar2 = (AssertHelperData *)std::char_traits<char>::length((char_type *)0x12c643);
  this_02[1].data_ = pAVar2;
  local_18 = local_290;
  ktx::SelectorRange::SelectorRange
            (in_stack_fffffffffffff7f0,(RangeIndex)((ulong)in_stack_fffffffffffff7e8 >> 0x20),
             (RangeIndex)in_stack_fffffffffffff7e8);
  local_380 = local_5d0;
  local_390 = local_5e0.data_;
  uStack_388 = local_5d8;
  local_1d0 = &local_390;
  local_3a8 = local_5e0.data_;
  local_398 = &local_5f8;
  local_1c8 = local_3a8;
  local_3c8[0] = fmt::v10::
                 make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,ktx::SelectorRange>
                           (&local_5f8,local_380,(SelectorRange *)local_5e0.data_);
  local_e8 = &local_3b8;
  local_f0 = local_3c8;
  local_d8 = 0xf;
  local_3b8 = 0xf;
  local_e0 = local_f0;
  local_d0 = local_e8;
  local_c8 = local_f0;
  local_3b0 = local_f0;
  fmt::v10::vformat_abi_cxx11_(in_stack_fffffffffffffa48,in_stack_fffffffffffffa38);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[3],_nullptr>
            (in_stack_fffffffffffff7e8,in_stack_fffffffffffff7e0,in_stack_fffffffffffff7d8,
             (char (*) [3])in_stack_fffffffffffff7d0);
  std::__cxx11::string::~string((string *)local_5d0);
  ktx::SelectorRange::~SelectorRange((SelectorRange *)0x12c835);
  bVar1 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xfffffffffffffa50);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff800);
    in_stack_fffffffffffff848 =
         (Message *)testing::AssertionResult::failure_message((AssertionResult *)0x12c8c4);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff800,type,(char *)in_stack_fffffffffffff7f0,
               (int)((ulong)in_stack_fffffffffffff7e8 >> 0x20),in_stack_fffffffffffff7e0);
    testing::internal::AssertHelper::operator=(this_02,in_stack_fffffffffffff848);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffff7d0);
    testing::Message::~Message((Message *)0x12c927);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x12c998);
  local_268 = &local_648;
  local_270 = "{}";
  local_260 = "{}";
  local_648 = (SelectorRange *)0x1d8be9;
  local_258 = local_268;
  local_640 = std::char_traits<char>::length((char_type *)0x12c9fc);
  local_20 = local_270;
  ktx::SelectorRange::SelectorRange
            (in_stack_fffffffffffff7f0,(RangeIndex)((ulong)in_stack_fffffffffffff7e8 >> 0x20),
             (RangeIndex)in_stack_fffffffffffff7e8);
  local_3d0 = local_638;
  local_3e0 = local_648;
  sStack_3d8 = local_640;
  local_1b0 = &local_3e0;
  local_3f8 = local_648;
  local_3f0 = local_640;
  local_3e8 = &local_660;
  local_1a8 = local_3f8;
  sStack_1a0 = local_3f0;
  local_418[0] = fmt::v10::
                 make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,ktx::SelectorRange>
                           (&local_660,local_3d0,local_648);
  local_b8 = &local_408;
  local_c0 = local_418;
  local_a8 = 0xf;
  local_408 = 0xf;
  local_b0 = local_c0;
  local_a0 = local_b8;
  local_98 = local_c0;
  local_400 = local_c0;
  fmt::v10::vformat_abi_cxx11_(in_stack_fffffffffffffa48,in_stack_fffffffffffffa38);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[5],_nullptr>
            (in_stack_fffffffffffff7e8,in_stack_fffffffffffff7e0,in_stack_fffffffffffff7d8,
             (char (*) [5])in_stack_fffffffffffff7d0);
  std::__cxx11::string::~string((string *)local_638);
  ktx::SelectorRange::~SelectorRange((SelectorRange *)0x12cbd6);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_618);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff800);
    testing::AssertionResult::failure_message((AssertionResult *)0x12cc65);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffff800,type,(char *)in_stack_fffffffffffff7f0,
               (int)((ulong)in_stack_fffffffffffff7e8 >> 0x20),in_stack_fffffffffffff7e0);
    testing::internal::AssertHelper::operator=(this_02,in_stack_fffffffffffff848);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffff7d0);
    testing::Message::~Message((Message *)0x12ccc2);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x12cd33);
  this_01 = &local_6b0;
  local_250 = "{}";
  local_240 = "{}";
  local_6b0.data_ = (AssertHelperData *)0x1d8be9;
  local_248 = this_01;
  local_238 = this_01;
  pAVar2 = (AssertHelperData *)std::char_traits<char>::length((char_type *)0x12cd97);
  this_01[1].data_ = pAVar2;
  local_28 = local_250;
  ktx::SelectorRange::SelectorRange
            (in_stack_fffffffffffff7f0,(RangeIndex)((ulong)in_stack_fffffffffffff7e8 >> 0x20),
             (RangeIndex)in_stack_fffffffffffff7e8);
  local_420 = local_6a0;
  local_430 = local_6b0.data_;
  uStack_428 = local_6a8;
  local_190 = &local_430;
  local_448 = local_6b0.data_;
  local_438 = &local_6c8;
  local_188 = local_448;
  local_468[0] = fmt::v10::
                 make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,ktx::SelectorRange>
                           (&local_6c8,local_420,(SelectorRange *)local_6b0.data_);
  local_88 = &local_458;
  local_90 = local_468;
  local_78 = 0xf;
  local_458 = 0xf;
  local_80 = local_90;
  local_70 = local_88;
  local_68 = local_90;
  local_450 = local_90;
  fmt::v10::vformat_abi_cxx11_(in_stack_fffffffffffffa48,in_stack_fffffffffffffa38);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[7],_nullptr>
            (in_stack_fffffffffffff7e8,in_stack_fffffffffffff7e0,in_stack_fffffffffffff7d8,
             (char (*) [7])in_stack_fffffffffffff7d0);
  std::__cxx11::string::~string((string *)local_6a0);
  ktx::SelectorRange::~SelectorRange((SelectorRange *)0x12cf74);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_680);
  if (!bVar1) {
    testing::Message::Message((Message *)this_01);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x12d003);
    type = (Type)((ulong)pcVar3 >> 0x20);
    testing::internal::AssertHelper::AssertHelper
              (this_01,type,(char *)in_stack_fffffffffffff7f0,
               (int)((ulong)in_stack_fffffffffffff7e8 >> 0x20),in_stack_fffffffffffff7e0);
    testing::internal::AssertHelper::operator=(this_02,in_stack_fffffffffffff848);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffff7d0);
    testing::Message::~Message((Message *)0x12d060);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x12d0d1);
  lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_718;
  local_230 = "{}";
  local_220 = "{}";
  local_718 = (SelectorRange *)0x1d8be9;
  local_228 = lhs;
  local_218 = lhs;
  sVar4 = std::char_traits<char>::length((char_type *)0x12d135);
  lhs->_M_string_length = sVar4;
  local_30 = local_230;
  __return_storage_ptr__ = &local_730;
  ktx::SelectorRange::SelectorRange
            (in_stack_fffffffffffff7f0,(RangeIndex)((ulong)in_stack_fffffffffffff7e8 >> 0x20),
             (RangeIndex)in_stack_fffffffffffff7e8);
  local_470 = local_708;
  local_480 = local_718;
  sStack_478 = local_710;
  local_170 = &local_480;
  local_498 = local_718;
  local_488 = __return_storage_ptr__;
  local_168 = local_498;
  file = fmt::v10::
         make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,ktx::SelectorRange>
                   (__return_storage_ptr__,local_470,local_718);
  local_58 = &local_4a8;
  local_60 = local_4b8;
  local_48 = 0xf;
  local_4a8 = 0xf;
  pcVar3 = extraout_RDX;
  local_4b8[0] = file;
  local_50 = local_60;
  local_40 = local_58;
  local_38 = local_60;
  local_4a0 = local_60;
  fmt::v10::vformat_abi_cxx11_(in_stack_fffffffffffffa48,in_stack_fffffffffffffa38);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[4],_nullptr>
            (pcVar3,(char *)__return_storage_ptr__,lhs,(char (*) [4])in_stack_fffffffffffff7d0);
  line = (int)((ulong)pcVar3 >> 0x20);
  std::__cxx11::string::~string((string *)local_708);
  ktx::SelectorRange::~SelectorRange((SelectorRange *)0x12d30f);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_6e8);
  if (!bVar1) {
    testing::Message::Message((Message *)this_01);
    this_00 = (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x12d39e)
    ;
    testing::internal::AssertHelper::AssertHelper
              (this_01,type,(char *)file,line,(char *)__return_storage_ptr__);
    testing::internal::AssertHelper::operator=(this_02,in_stack_fffffffffffff848);
    testing::internal::AssertHelper::~AssertHelper(this_00);
    testing::Message::~Message((Message *)0x12d3fb);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x12d466);
  return;
}

Assistant:

TEST_F(FragmentURITest, SelectorRangeToString) {
    EXPECT_EQ(fmt::format("{}", ktx::SelectorRange{0, 0}), "none");
    EXPECT_EQ(fmt::format("{}", ktx::SelectorRange{0, 1}), "0");
    EXPECT_EQ(fmt::format("{}", ktx::SelectorRange{10, 11}), "10");
    EXPECT_EQ(fmt::format("{}", ktx::SelectorRange{0, 2}), "0..1");
    EXPECT_EQ(fmt::format("{}", ktx::SelectorRange{10, 12}), "10..11");
    EXPECT_EQ(fmt::format("{}", ktx::SelectorRange{0, ktx::RangeEnd}), "all");
}